

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(SimpleParallelAnalyzerSettings *this)

{
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  *puVar3;
  AnalyzerSettingInterfaceChannel *pAVar4;
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceNumberList *this_01;
  long lVar5;
  ulong uVar6;
  value_type *__x;
  Channel *pCVar7;
  uint uVar8;
  U32 i;
  AnalyzerSettingInterfaceChannel *data_channel_interface;
  Channel *local_98;
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  *local_90;
  vector<Channel,_std::allocator<Channel>_> *local_88;
  vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  *local_80;
  char text [64];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0010cd70;
  local_88 = &this->mDataChannels;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = &this->mClockChannel;
  __x = (value_type *)0xffffffffffffffff;
  Channel::Channel(local_98,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mClockEdge = PosEdge;
  local_80 = &this->mDataChannelsInterface;
  local_90 = &this->mClockChannelInterface;
  puVar1 = &this->mClockEdgeInterface;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClockChannelInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mClockEdgeInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  uVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 0x10) {
    Channel::Channel((Channel *)text,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    pCVar7 = (Channel *)text;
    std::vector<Channel,_std::allocator<Channel>_>::emplace_back<Channel>(local_88,(Channel *)text);
    Channel::~Channel((Channel *)text);
    pAVar4 = (AnalyzerSettingInterfaceChannel *)
             AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar7);
    AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar4);
    data_channel_interface = pAVar4;
    sprintf(text,"D%d",uVar6);
    AnalyzerSettingInterface::SetTitleAndTooltip((char *)data_channel_interface,text);
    AnalyzerSettingInterfaceChannel::SetChannel((Channel *)data_channel_interface);
    AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(data_channel_interface,0));
    __x = &data_channel_interface;
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    push_back(local_80,__x);
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)__x);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  puVar3 = local_90;
  pAVar4 = (local_90->_M_t).
           super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  (local_90->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl = this_00;
  if (pAVar4 != (AnalyzerSettingInterfaceChannel *)0x0) {
    (**(code **)(*(long *)pAVar4 + 8))();
    this_00 = (puVar3->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00,"Clock");
  pCVar7 = local_98;
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (local_90->_M_t).
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  this_01 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_01);
  pAVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = this_01;
  if (pAVar2 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar2 + 8))();
    this_01 = (puVar1->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"Clock State");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(puVar1->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Rising edge");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(puVar1->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Falling edge");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(puVar1->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Dual edge");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mClockEdge);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  }
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar8 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar8,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  uVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 0x10) {
    sprintf(text,"D%d",uVar6);
    AnalyzerSettings::AddChannel
              ((Channel *)this,
               (char *)((this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar5),SUB81(text,0));
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)local_98,true);
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ), mClockEdge( ParallelAnalyzerClockEdge::PosEdge )
{
    U32 count = 16;
    for( U32 i = 0; i < count; i++ )
    {
        mDataChannels.push_back( UNDEFINED_CHANNEL );
        AnalyzerSettingInterfaceChannel* data_channel_interface = new AnalyzerSettingInterfaceChannel();

        char text[ 64 ];
        sprintf( text, "D%d", i );

        data_channel_interface->SetTitleAndTooltip( text, text );
        data_channel_interface->SetChannel( mDataChannels[ i ] );
        data_channel_interface->SetSelectionOfNoneIsAllowed( true );

        mDataChannelsInterface.push_back( data_channel_interface );
    }


    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "Clock", "Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mClockEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mClockEdgeInterface->SetTitleAndTooltip( "Clock State", "Define whether the data is valid on Clock rising or falling edge" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::PosEdge ), "Rising edge", "" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::NegEdge ), "Falling edge", "" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::DualEdge ), "Dual edge", "" );
    mClockEdgeInterface->SetNumber( static_cast<double>( mClockEdge ) );


    for( U32 i = 0; i < count; i++ )
    {
        AddInterface( mDataChannelsInterface[ i ] );
    }

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mClockEdgeInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    for( U32 i = 0; i < count; i++ )
    {
        char text[ 64 ];
        sprintf( text, "D%d", i );
        AddChannel( mDataChannels[ i ], text, false );
    }

    AddChannel( mClockChannel, "Clock", false );
}